

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.c
# Opt level: O3

int utf8_range_IsValid(char *data,size_t len)

{
  ulong *puVar1;
  long lVar2;
  size_t sVar3;
  ulong *end;
  ulong *puVar4;
  ulong *data_00;
  
  if (len == 0) {
    return 1;
  }
  end = (ulong *)(data + len);
  puVar4 = (ulong *)data;
  if (7 < (long)len) {
    do {
      if ((*puVar4 & 0x8080808080808080) != 0) break;
      puVar4 = puVar4 + 1;
      data = data + 8;
      len = len - 8;
    } while (7 < (long)len);
  }
  data_00 = puVar4;
  if (puVar4 < end) {
    lVar2 = (long)end - (long)data;
    puVar1 = (ulong *)((long)puVar4 + lVar2);
    do {
      data_00 = puVar4;
      if ((char)*puVar4 < '\0') break;
      puVar4 = (ulong *)((long)puVar4 + 1);
      lVar2 = lVar2 + -1;
      data_00 = puVar1;
    } while (lVar2 != 0);
  }
  sVar3 = utf8_range_ValidateUTF8Naive((char *)data_00,(char *)end,0);
  return (int)(sVar3 != 0);
}

Assistant:

int utf8_range_IsValid(const char* data, size_t len) {
  return utf8_range_Validate(data, len, /*return_position=*/0) != 0;
}